

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

void __thiscall xLearn::InmemReader::init_from_txt(InmemReader *this)

{
  long lVar1;
  Parser *pPVar2;
  size_t sVar3;
  DMatrix *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint64_t hash_2;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  long in_RDI;
  bool in_stack_00000027;
  size_t in_stack_00000028;
  DMatrix *in_stack_00000030;
  string bin_file;
  int i;
  size_t ret;
  FILE *file;
  uint64 read_byte;
  Reader *in_stack_000000c8;
  char *in_stack_00000108;
  char *in_stack_00000110;
  size_t in_stack_000001b8;
  char *in_stack_000001c0;
  FILE *in_stack_000001c8;
  string *in_stack_000002a8;
  DMatrix *in_stack_000002b0;
  undefined1 in_stack_00000317;
  string *in_stack_00000318;
  string *in_stack_ffffffffffffff38;
  Parser *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  value_type vVar7;
  size_type in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff88;
  Reader *in_stack_ffffffffffffff90;
  value_type local_54;
  string local_28 [40];
  
  Reader::check_file_format_abi_cxx11_(in_stack_000000c8);
  std::__cxx11::string::c_str();
  pPVar2 = Reader::CreateParser(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *(Parser **)(in_RDI + 0x90) = pPVar2;
  std::__cxx11::string::~string(local_28);
  if ((*(byte *)(in_RDI + 0x98) & 1) == 0) {
    Parser::setLabel(*(Parser **)(in_RDI + 0x90),false);
  }
  else {
    Parser::setLabel(*(Parser **)(in_RDI + 0x90),true);
  }
  Parser::setSplitor(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  lVar1 = *(long *)(in_RDI + 200);
  std::__cxx11::string::c_str();
  OpenFileOrDie(in_stack_00000110,in_stack_00000108);
  while( true ) {
    sVar3 = ReadDataFromDisk(in_stack_000001c8,in_stack_000001c0,in_stack_000001b8);
    if (sVar3 == 0) break;
    if (sVar3 == lVar1 << 0x14) {
      Reader::shrink_block
                ((Reader *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48,(size_t *)in_stack_ffffffffffffff40,
                 (FILE *)in_stack_ffffffffffffff38);
    }
    (**(code **)(**(long **)(in_RDI + 0x90) + 0x10))
              (*(long **)(in_RDI + 0x90),*(undefined8 *)(in_RDI + 0xc0),sVar3,in_RDI + 0xd8,0);
  }
  this_00 = (DMatrix *)(in_RDI + 0xd8);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          HashFile(in_stack_00000318,(bool)in_stack_00000317);
  hash_2 = HashFile(in_stack_00000318,(bool)in_stack_00000317);
  DMatrix::SetHash(this_00,(uint64)__lhs,hash_2);
  *(byte *)(in_RDI + 0x138) = *(byte *)(in_RDI + 0x98) & 1;
  *(undefined4 *)(in_RDI + 0x140) = *(undefined4 *)(in_RDI + 0xe8);
  DMatrix::ReAlloc(in_stack_00000030,in_stack_00000028,in_stack_00000027);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
             in_stack_ffffffffffffff58);
  local_54 = 0;
  while( true ) {
    uVar4 = (ulong)(int)local_54;
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x148));
    if (sVar5 <= uVar4) break;
    vVar7 = local_54;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x148),
                        (long)(int)local_54);
    *pvVar6 = vVar7;
    local_54 = local_54 + 1;
  }
  if ((*(byte *)(in_RDI + 0x9a) & 1) != 0) {
    std::operator+(__lhs,(char *)this_00);
    DMatrix::Serialize(in_stack_000002b0,in_stack_000002a8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  }
  if (*(void **)(in_RDI + 0xc0) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0xc0));
  }
  Close((FILE *)bin_file._0_8_);
  return;
}

Assistant:

void InmemReader::init_from_txt() {
  // Init parser_                       
  parser_ = CreateParser(check_file_format().c_str());
  if (has_label_) parser_->setLabel(true);
  else parser_->setLabel(false);
  // Set splitor
  parser_->setSplitor(this->splitor_);
  // Convert MB to Byte
  uint64 read_byte = block_size_ * 1024 * 1024;
  // Open file
#ifndef _MSC_VER
  FILE* file = OpenFileOrDie(filename_.c_str(), "r");
#else
  FILE* file = OpenFileOrDie(filename_.c_str(), "rb");
#endif
  // Read until the end of file
  for (;;) {
    // Read a block of data from disk file
    size_t ret = ReadDataFromDisk(file, block_, read_byte);
    if (ret == 0) {
      break;
    } else if (ret == read_byte) {
      // Find the last '\n', and shrink back file pointer
      this->shrink_block(block_, &ret, file);
    } // else ret < read_byte: we don't need shrink_block()
    parser_->Parse(block_, ret, data_buf_, false);
  }
  data_buf_.SetHash(HashFile(filename_, true),
                    HashFile(filename_, false));
  data_buf_.has_label = has_label_;
  // Init data_samples_ 
  num_samples_ = data_buf_.row_length;
  data_samples_.ReAlloc(num_samples_, has_label_);
  // for shuffle
  order_.resize(num_samples_);
  for (int i = 0; i < order_.size(); ++i) {
    order_[i] = i;
  }
  // Deserialize in-memory buffer to disk file.
  if (bin_out_) {
    std::string bin_file = filename_ + ".bin";
    data_buf_.Serialize(bin_file);
  }
  delete [] block_;
  Close(file);
}